

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.cc
# Opt level: O0

void __thiscall Graph::update_edge(Graph *this,string *begin,string *end,double weight)

{
  bool bVar1;
  __type _Var2;
  GNode *pGVar3;
  GNode *__rhs;
  reference pGVar4;
  ostream *poVar5;
  GEdge *edge;
  iterator __end3;
  iterator __begin3;
  vector<Graph::GEdge,_std::allocator<Graph::GEdge>_> *__range3;
  GNode *dest;
  GNode *origin;
  double weight_local;
  string *end_local;
  string *begin_local;
  Graph *this_local;
  
  bVar1 = search(this,begin);
  if (bVar1) {
    pGVar3 = get_node(this,begin);
    bVar1 = search(this,end);
    if (bVar1) {
      __rhs = get_node(this,end);
      __end3 = std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>::begin(&pGVar3->edges);
      edge = (GEdge *)std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>::end(&pGVar3->edges);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Graph::GEdge_*,_std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>_>
                                         *)&edge), bVar1) {
        pGVar4 = __gnu_cxx::
                 __normal_iterator<Graph::GEdge_*,_std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>_>
                 ::operator*(&__end3);
        _Var2 = std::operator==(&pGVar4->node->name,&__rhs->name);
        if (_Var2) {
          pGVar4->weight = weight;
        }
        __gnu_cxx::
        __normal_iterator<Graph::GEdge_*,_std::vector<Graph::GEdge,_std::allocator<Graph::GEdge>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Error: no node \"");
      poVar5 = std::operator<<(poVar5,(string *)end);
      std::operator<<(poVar5,"\" exists \n");
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Error: no node \"");
    poVar5 = std::operator<<(poVar5,(string *)begin);
    std::operator<<(poVar5,"\" exists \n");
  }
  return;
}

Assistant:

void Graph::update_edge(const std::string &begin, const std::string &end, double weight) {
    if (search(begin)) {
        GNode *origin = get_node(begin);
        GNode *dest;

        if (search(end)) {
            dest = get_node(end);
            for (auto & edge : origin->edges) {
                if (edge.node->name == dest->name) {
                    edge.weight = weight;
                }
            }
        } else {
            cout << "Error: no node \"" << end << "\" exists \n";
        }
    } else {
        cout << "Error: no node \"" << begin << "\" exists \n";
    }
}